

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O2

bool google::protobuf::compiler::csharp::IsDescriptorProto(FileDescriptor *descriptor)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  
  __y._M_str = "google/protobuf/descriptor.proto";
  __y._M_len = 0x20;
  __x._M_str = (descriptor->name_->_M_dataplus)._M_p;
  __x._M_len = descriptor->name_->_M_string_length;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    return true;
  }
  __y_00._M_str = "net/proto2/proto/descriptor.proto";
  __y_00._M_len = 0x21;
  __x_00._M_str = (descriptor->name_->_M_dataplus)._M_p;
  __x_00._M_len = descriptor->name_->_M_string_length;
  bVar1 = std::operator==(__x_00,__y_00);
  return bVar1;
}

Assistant:

inline bool IsDescriptorProto(const FileDescriptor* descriptor) {
  return descriptor->name() == "google/protobuf/descriptor.proto" ||
         descriptor->name() == "net/proto2/proto/descriptor.proto";
}